

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmatchQbf.cpp
# Opt level: O2

void Bmatch_Construct_MUXes
               (vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> *Pi_Pool,Abc_Obj_t **pObj2,
               Abc_Ntk_t **pNtk_Qbf,int *level,int *fForPi)

{
  int iVar1;
  pointer ppAVar2;
  pointer ppAVar3;
  Abc_Aig_t *pMan;
  char *pcVar4;
  Abc_Obj_t *pAVar5;
  char *pcVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t_ *p0;
  ulong uVar8;
  ulong uVar9;
  char *pPrefix;
  int i;
  ulong uVar10;
  vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_> new_Pi_Pool;
  Abc_Obj_t *local_38;
  
  new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ppAVar2 = (Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppAVar3 = (Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppAVar3 != ppAVar2) {
    if ((ulong)((long)ppAVar3 - (long)ppAVar2) < 9) {
      if (*fForPi == 1) {
        pAVar5 = Abc_NtkCreatePi(*pNtk_Qbf);
        iVar1 = *fForPi;
        pcVar4 = Abc_ObjName(*pObj2);
        pcVar6 = "y_";
        if (iVar1 == 1) {
          pcVar6 = "x_";
        }
        pcVar4 = Bmatch_NameAddPrefix(pcVar6,2,pcVar4);
        Abc_ObjAssignName(pAVar5,pcVar4,"_*");
        operator_delete(pcVar4,1);
        pMan = (Abc_Aig_t *)(*pNtk_Qbf)->pManFunc;
        pAVar7 = Abc_AigConst1(*pNtk_Qbf);
        p0 = Abc_AigMux(pMan,pAVar5,(Abc_Obj_t *)((ulong)pAVar7 ^ 1),
                        *(Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>).
                         _M_impl.super__Vector_impl_data._M_start);
      }
      else {
        p0 = *ppAVar2;
      }
      pAVar5 = Abc_NtkCreatePi(*pNtk_Qbf);
      iVar1 = *fForPi;
      pcVar4 = Abc_ObjName(*pObj2);
      pcVar6 = "y_";
      if (iVar1 == 1) {
        pcVar6 = "x_";
      }
      pcVar4 = Bmatch_NameAddPrefix(pcVar6,2,pcVar4);
      Abc_ObjAssignName(pAVar5,pcVar4,"_0");
      operator_delete(pcVar4,1);
      pAVar5 = Abc_AigMux((Abc_Aig_t *)(*pNtk_Qbf)->pManFunc,pAVar5,(Abc_Obj_t *)((ulong)p0 ^ 1),p0)
      ;
      ((*pObj2)->field_6).pCopy = pAVar5;
    }
    else {
      pcVar4 = (char *)operator_new__(10);
      sprintf(pcVar4,"_%d",(ulong)(uint)*level);
      *level = *level + 1;
      pAVar5 = Abc_NtkCreatePi(*pNtk_Qbf);
      iVar1 = *fForPi;
      pcVar6 = Abc_ObjName(*pObj2);
      pPrefix = "y_";
      if (iVar1 == 1) {
        pPrefix = "x_";
      }
      pcVar6 = Bmatch_NameAddPrefix(pPrefix,2,pcVar6);
      Abc_ObjAssignName(pAVar5,pcVar6,pcVar4);
      operator_delete(pcVar6,1);
      uVar10 = 0;
      while( true ) {
        ppAVar2 = (Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>)._M_impl
                  .super__Vector_impl_data._M_start;
        uVar9 = (long)(Pi_Pool->super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppAVar2;
        uVar8 = ((long)uVar9 >> 3) - 1;
        if (uVar8 <= uVar10) break;
        local_38 = Abc_AigMux((Abc_Aig_t *)(*pNtk_Qbf)->pManFunc,pAVar5,ppAVar2[uVar10 + 1],
                              ppAVar2[uVar10]);
        std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back(&new_Pi_Pool,&local_38);
        uVar10 = uVar10 + 2;
      }
      if ((uVar9 & 8) != 0) {
        std::vector<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::push_back
                  (&new_Pi_Pool,ppAVar2 + uVar8);
      }
      Bmatch_Construct_MUXes(&new_Pi_Pool,pObj2,pNtk_Qbf,level,fForPi);
    }
    std::_Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>::~_Vector_base
              (&new_Pi_Pool.super__Vector_base<Abc_Obj_t__*,_std::allocator<Abc_Obj_t__*>_>);
    return;
  }
  __assert_fail("Pi_Pool.size() >= 1",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bmatch/bmatchQbf.cpp"
                ,0x123,
                "void Bmatch_Construct_MUXes(vector<Abc_Obj_t *> &, Abc_Obj_t *&, Abc_Ntk_t *&, int &, int &)"
               );
}

Assistant:

void Bmatch_Construct_MUXes( vector< Abc_Obj_t * > & Pi_Pool, Abc_Obj_t *& pObj2, Abc_Ntk_t *& pNtk_Qbf, int & level, int & fForPi)
{
    vector< Abc_Obj_t * > new_Pi_Pool;
    Abc_Obj_t * pObj, * pObjA;
    char * pSuffix, * pName;

    assert( Pi_Pool.size() >= 1);
    if( Pi_Pool.size() >= 2){
        pSuffix = new char[10];
        sprintf( pSuffix, "_%d", level);
        ++level;

        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        if( fForPi == 1 ){
        pName = "x_";
        }
        else{
            pName = "y_";
        }
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(pObj2));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        for( int i = 0; i < Pi_Pool.size() - 1; i = i + 2 ){
            pObj = Abc_AigMux( (Abc_Aig_t * )pNtk_Qbf->pManFunc, pObjA, Pi_Pool[i + 1], Pi_Pool[i] );
            new_Pi_Pool.push_back( pObj );
        }
        if( !(Pi_Pool.size() % 2 == 0) ){
            new_Pi_Pool.push_back( Pi_Pool[ Pi_Pool.size() - 1 ] );
        }
        Bmatch_Construct_MUXes( new_Pi_Pool, pObj2, pNtk_Qbf, level, fForPi );
    }
    else{
        pObj = Pi_Pool[0];
        if( fForPi == 1 ){
            pSuffix = "_*\0";
            pObjA = Abc_NtkCreatePi( pNtk_Qbf );

            if( fForPi == 1 ){
                pName = "x_";
            }
            else{
                pName = "y_";
            }
            pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(pObj2));
            Abc_ObjAssignName( pObjA, pName, pSuffix );
            delete pName;
            
            pObj = Abc_AigMux( (Abc_Aig_t * )pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot(Abc_AigConst1(pNtk_Qbf)), Pi_Pool[0] );
        }
        pSuffix = "_0\0";
        pObjA = Abc_NtkCreatePi( pNtk_Qbf );

        if( fForPi == 1 ){
            pName = "x_";
        }
        else{
            pName = "y_";
        }
        pName = Bmatch_NameAddPrefix(pName, 2, Abc_ObjName(pObj2));
        Abc_ObjAssignName( pObjA, pName, pSuffix );
        delete pName;

        pObj = Abc_AigMux( (Abc_Aig_t * )pNtk_Qbf->pManFunc, pObjA, Abc_ObjNot( pObj ), pObj );
        pObj2->pCopy = pObj;
    }
}